

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

void FStateDefinitions::FixStatePointers
               (PClassActor *actor,TArray<FStateDefine,_FStateDefine> *list)

{
  FStateDefine *pFVar1;
  ulong uVar2;
  long lVar3;
  
  if (list->Count != 0) {
    lVar3 = 0x20;
    uVar2 = 0;
    do {
      pFVar1 = list->Array;
      if (*(char *)((long)&(pFVar1->Label).Index + lVar3) == '\x05') {
        *(FState **)((long)pFVar1 + lVar3 + -8) =
             actor->OwnedStates + *(long *)((long)pFVar1 + lVar3 + -8) + -1;
        *(undefined1 *)((long)&(pFVar1->Label).Index + lVar3) = 1;
      }
      if (*(int *)((long)pFVar1 + lVar3 + -0xc) != 0) {
        FixStatePointers(actor,(TArray<FStateDefine,_FStateDefine> *)((long)pFVar1 + lVar3 + -0x18))
        ;
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar2 < list->Count);
  }
  return;
}

Assistant:

void FStateDefinitions::FixStatePointers (PClassActor *actor, TArray<FStateDefine> & list)
{
	for (unsigned i = 0; i < list.Size(); i++)
	{
		if (list[i].DefineFlags == SDF_INDEX)
		{
			size_t v = (size_t)list[i].State;
			list[i].State = actor->OwnedStates + v - 1;
			list[i].DefineFlags = SDF_STATE;
		}
		if (list[i].Children.Size() > 0)
		{
			FixStatePointers(actor, list[i].Children);
		}
	}
}